

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::DynamicState::DynamicState
          (DynamicState *this,
          vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *_dynamicStates)

{
  size_type sVar1;
  reference pvVar2;
  value_type local_24;
  ulong local_20;
  size_t i;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *_dynamicStates_local;
  DynamicState *this_local;
  
  i = (size_t)_dynamicStates;
  _dynamicStates_local = (vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)this;
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            (&this->m_dynamicStates);
  (this->super_VkPipelineDynamicStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  (this->super_VkPipelineDynamicStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineDynamicStateCreateInfo).flags = 0;
  sVar1 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::size
                    ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)i);
  if (sVar1 == 0) {
    for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
      local_24 = (value_type)local_20;
      std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::push_back
                (&this->m_dynamicStates,&local_24);
    }
  }
  else {
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator=
              (&this->m_dynamicStates,
               (vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)i);
  }
  sVar1 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::size
                    (&this->m_dynamicStates);
  (this->super_VkPipelineDynamicStateCreateInfo).dynamicStateCount = (deUint32)sVar1;
  pvVar2 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator[]
                     (&this->m_dynamicStates,0);
  (this->super_VkPipelineDynamicStateCreateInfo).pDynamicStates = pvVar2;
  return;
}

Assistant:

PipelineCreateInfo::DynamicState::DynamicState (const std::vector<vk::VkDynamicState>& _dynamicStates)
{
	sType	= vk::VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
	pNext	= DE_NULL;
	flags	= 0;

	if (!_dynamicStates.size())
	{
		for (size_t i = 0; i < vk::VK_DYNAMIC_STATE_LAST; ++i)
		{
			m_dynamicStates.push_back(static_cast<vk::VkDynamicState>(i));
		}
	}
	else
		m_dynamicStates = _dynamicStates;

	dynamicStateCount = static_cast<deUint32>(m_dynamicStates.size());
	pDynamicStates = &m_dynamicStates[0];
}